

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O3

void __thiscall FileTest_Read_Test::TestBody(FileTest_Read_Test *this)

{
  bool bVar1;
  size_t __nbytes;
  char *message;
  file f;
  AssertionResult gtest_ar;
  file local_44;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  open_file();
  __nbytes = strlen("Don\'t panic!");
  read_abi_cxx11_((int)&local_28,&local_44,__nbytes);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            (local_38,"FILE_CONTENT","read(f, std::strlen(FILE_CONTENT))",&FILE_CONTENT,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
               ,0x115,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_28._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_28._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_28._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fmt::v5::file::~file(&local_44);
  return;
}

Assistant:

TEST(FileTest, Read) {
  file f = open_file();
  EXPECT_READ(f, FILE_CONTENT);
}